

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QMargins *m)

{
  QDataStream *this;
  QDataStream *pQVar1;
  QDataStream *in_RDI;
  QDataStream *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe8;
  qint32 qVar2;
  
  qVar2 = (qint32)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  QMargins::left((QMargins *)0x6267c6);
  this = QDataStream::operator<<(in_stack_ffffffffffffffd8,qVar2);
  QMargins::top((QMargins *)0x6267e1);
  QDataStream::operator<<(this,qVar2);
  QMargins::right((QMargins *)0x6267fc);
  pQVar1 = QDataStream::operator<<(this,qVar2);
  qVar2 = (qint32)((ulong)pQVar1 >> 0x20);
  QMargins::bottom((QMargins *)0x626817);
  QDataStream::operator<<(this,qVar2);
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QMargins &m)
{
    s << m.left() << m.top() << m.right() << m.bottom();
    return s;
}